

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

bytecode_t * tchecker::compile(typed_expression_t *expr)

{
  pointer __src;
  bytecode_t *__dest;
  invalid_argument *this;
  runtime_error *this_00;
  ulong uVar1;
  size_t __n;
  vector<long,_std::allocator<long>_> bytecode;
  long local_80 [4];
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  compiler;
  
  compiler._bytecode_back_inserter.container = &bytecode;
  if (expr->_type == EXPR_TYPE_BAD) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"invalid expression");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  compiler.super_typed_expression_visitor_t._vptr_typed_expression_visitor_t =
       (_func_int **)&PTR__typed_expression_visitor_t_00257b30;
  (**(code **)(*(long *)expr + 0x30))(expr);
  local_80[0] = 0;
  std::vector<long,_std::allocator<long>_>::emplace_back<long>(&bytecode,local_80);
  __src = bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start;
  __n = (long)bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"compilation produced no bytecode");
  }
  else {
    if (bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] == 0) {
      uVar1 = 0xffffffffffffffff;
      if (-1 < (long)__n) {
        uVar1 = __n;
      }
      __dest = (bytecode_t *)operator_new__(uVar1);
      memcpy(__dest,__src,__n);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&bytecode.super__Vector_base<long,_std::allocator<long>_>);
      return __dest;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"bytecode is not null-terminated");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tchecker::bytecode_t * compile(tchecker::typed_expression_t const & expr)
{
  try {
    if (expr.type() == tchecker::EXPR_TYPE_BAD)
      throw std::invalid_argument("invalid expression");

    // Compilation
    std::vector<tchecker::bytecode_t> bytecode;
    auto back_inserter = std::back_inserter(bytecode);

    tchecker::details::rvalue_expression_compiler_t<decltype(back_inserter)> compiler(back_inserter);
    expr.visit(compiler);
    back_inserter = tchecker::VM_RET;

    // Production
    if (bytecode.size() == 0)
      throw std::runtime_error("compilation produced no bytecode");
    if (bytecode.back() != tchecker::VM_RET)
      throw std::runtime_error("bytecode is not null-terminated");

    tchecker::bytecode_t * b = new tchecker::bytecode_t[bytecode.size()];
    std::memcpy(b, bytecode.data(), bytecode.size() * sizeof(tchecker::bytecode_t));

    return b;
  }
  catch (std::invalid_argument const & e) {
    throw std::invalid_argument("compiling expression " + expr.to_string() + ", " + e.what());
  }
  catch (std::runtime_error const & e) {
    throw std::runtime_error("compiling expression " + expr.to_string() + ", " + e.what());
  }
}